

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void rtosc::map_arg_vals(rtosc_arg_val_t *av,size_t n,MetaContainer meta)

{
  char *pcVar1;
  rtosc_arg_t *prVar2;
  char mapbuf [20];
  MetaContainer local_50;
  char local_48 [24];
  
  builtin_strncpy(local_48,"map ",5);
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  if (n != 0) {
    prVar2 = &av->val;
    local_50.str_ptr = meta.str_ptr;
    do {
      if (((rtosc_arg_val_t *)((long)prVar2 + -8))->type == 'i') {
        snprintf(local_48 + 4,0x10,"%d",(ulong)(uint)prVar2->i);
        pcVar1 = Port::MetaContainer::operator[](&local_50,local_48);
        if (pcVar1 != (char *)0x0) {
          ((rtosc_arg_val_t *)((long)prVar2 + -8))->type = 'S';
          prVar2->s = pcVar1;
        }
      }
      prVar2 = (rtosc_arg_t *)((long)prVar2 + 0x18);
      n = n - 1;
    } while (n != 0);
  }
  return;
}

Assistant:

void rtosc::map_arg_vals(rtosc_arg_val_t* av, size_t n,
                         Port::MetaContainer meta)
{
    char mapbuf[20] = "map ";

    for(size_t i = 0; i < n; ++i, ++av)
    {
        if(av->type == 'i')
        {
            snprintf(mapbuf + 4, 16, "%d", av->val.i);
            const char* val = meta[mapbuf];
            if(val)
            {
                av->type = 'S';
                av->val.s = val;
            }
        }
    }
}